

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryOpenGL.cpp
# Opt level: O2

void __thiscall
Diligent::EngineFactoryOpenGLImpl::EnumerateAdapters
          (EngineFactoryOpenGLImpl *this,Version MinVersion,Uint32 *NumAdapters,
          GraphicsAdapterInfo *Adapters)

{
  Uint32 UVar1;
  
  if (Adapters == (GraphicsAdapterInfo *)0x0) {
    *NumAdapters = 1;
  }
  else {
    UVar1 = *NumAdapters;
    *NumAdapters = (uint)(UVar1 != 0);
    if (UVar1 != 0) {
      SetDefaultGraphicsAdapterInfo(Adapters);
      return;
    }
  }
  return;
}

Assistant:

void EngineFactoryOpenGLImpl::EnumerateAdapters(Version              MinVersion,
                                                Uint32&              NumAdapters,
                                                GraphicsAdapterInfo* Adapters) const
{
    if (Adapters == nullptr)
    {
        NumAdapters = 1;
        return;
    }

    NumAdapters = std::min(1u, NumAdapters);
    if (NumAdapters > 0)
    {
        SetDefaultGraphicsAdapterInfo(*Adapters);
    }
}